

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CByIndexExpression *exp)

{
  bool bVar1;
  pointer pIVar2;
  CByIndexExpression *exp_local;
  CConvertVisitor *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->identifier);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&exp->identifier);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"[");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&exp->indexExpression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&exp->indexExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,"]");
  return;
}

Assistant:

void CConvertVisitor::Visit(CByIndexExpression &exp)
{
	if (exp.identifier) {
		exp.identifier->Accept(*this);
	}
	this->code += "[";
	if (exp.indexExpression) {
		exp.indexExpression->Accept(*this);
	}
	this->code += "]";
}